

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::MultiTexShader::shadeFragments
          (MultiTexShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  pointer pVVar1;
  uint uVar2;
  int iVar3;
  pointer pMVar4;
  GenericVec4 *pGVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined8 uVar18;
  float afVar19 [2];
  ulong uVar20;
  long lVar21;
  long lVar22;
  FragmentPacket *packet;
  int iVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  Vector<float,_3> *vec_1;
  float v_3;
  float v;
  float fVar27;
  float fVar28;
  Vec3 coords3D [4];
  Vector<float,_2> vec_2;
  Vector<float,_4> res_3;
  Vector<float,_4> res_2;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  Vec4 texSamples [4];
  Vec4 outColors [4];
  float afStack_230 [2];
  Vec3 local_228;
  undefined8 uStack_21c;
  undefined4 local_214;
  undefined8 local_210;
  undefined4 uStack_208;
  float afStack_204 [3];
  Vec2 local_1f8;
  undefined8 uStack_1f0;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  float local_1d8 [4];
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  float local_1b8 [10];
  FragmentPacket *local_190;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  undefined8 local_170;
  int local_168 [4];
  float *local_158;
  int local_150 [4];
  float *local_140;
  int local_138 [4];
  Vec4 local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  float local_e8 [2];
  undefined8 uStack_e0;
  float local_d8 [2];
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  float local_b8 [16];
  undefined8 local_78;
  float afStack_70 [16];
  
  local_190 = packets;
  if (0 < numPackets) {
    local_188 = (ulong)(uint)numPackets;
    uVar20 = (ulong)*(uint *)&(this->super_ShaderProgram).field_0x154;
    local_178 = 0;
    local_180 = 0;
    do {
      afStack_70[10] = 0.0;
      afStack_70[0xb] = 0.0;
      afStack_70[0xc] = 0.0;
      afStack_70[0xd] = 0.0;
      afStack_70[6] = 0.0;
      afStack_70[7] = 0.0;
      afStack_70[8] = 0.0;
      afStack_70[9] = 0.0;
      afStack_70[2] = 0.0;
      afStack_70[3] = 0.0;
      afStack_70[4] = 0.0;
      afStack_70[5] = 0.0;
      local_78 = 0;
      afStack_70[0] = 0.0;
      afStack_70[1] = 0.0;
      if (0 < (int)uVar20) {
        packet = local_190 + local_180;
        fVar28 = 1.0 / (float)(int)uVar20;
        lVar25 = 0;
        lVar26 = 0;
        afStack_230[0] = fVar28;
        afStack_230[1] = fVar28;
        do {
          local_f8 = 0;
          uStack_f0 = 0;
          local_108 = 0;
          uStack_100 = 0;
          local_118 = 0;
          uStack_110 = 0;
          local_128.m_data[0] = 0.0;
          local_128.m_data[1] = 0.0;
          local_128.m_data[2] = 0.0;
          local_128.m_data[3] = 0.0;
          rr::readTriangleVarying<float>((rr *)&local_228,packet,context,0,0);
          local_e8[0] = local_228.m_data[0];
          local_e8[1] = local_228.m_data[1];
          uStack_e0 = 0;
          rr::readTriangleVarying<float>((rr *)&local_1f8,packet,context,0,1);
          local_d8[0] = local_1f8.m_data[0];
          local_d8[1] = local_1f8.m_data[1];
          uStack_d0 = 0;
          rr::readTriangleVarying<float>((rr *)&local_158,packet,context,0,2);
          local_c8 = local_158;
          uStack_c0 = 0;
          rr::readTriangleVarying<float>((rr *)&local_170,packet,context,0,3);
          local_b8[0] = (float)local_170;
          local_b8[1] = (float)local_170._4_4_;
          pMVar4 = (this->m_transformations).
                   super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_b8[0xc] = local_e8[0];
          local_b8[0xd] = local_e8[1];
          local_b8[0xe] = 1.0;
          local_b8[0xf] = 1.0;
          local_1b8[4] = 0.0;
          local_1b8[5] = 0.0;
          local_1b8[6] = 0.0;
          local_1b8[7] = 0.0;
          lVar21 = (long)(pMVar4->m_data).m_data[0].m_data + lVar25;
          lVar22 = 0;
          do {
            fVar27 = 0.0;
            lVar24 = 0;
            do {
              fVar27 = fVar27 + *(float *)(lVar21 + lVar24 * 4) *
                                *(float *)((long)local_b8 + lVar24 + 0x30);
              lVar24 = lVar24 + 4;
            } while (lVar24 != 0x10);
            local_1b8[lVar22 + 4] = fVar27;
            lVar22 = lVar22 + 1;
            lVar21 = lVar21 + 4;
          } while (lVar22 != 4);
          uStack_1f0 = 0x100000000;
          local_1e8 = 2;
          local_228.m_data[0] = 0.0;
          local_228.m_data[1] = 0.0;
          local_228.m_data[2] = 0.0;
          lVar21 = 2;
          do {
            afStack_230[lVar21] = local_1b8[(long)(int)local_1f8.m_data[lVar21] + 4];
            lVar21 = lVar21 + 1;
          } while (lVar21 != 5);
          local_b8[8] = local_d8[0];
          local_b8[9] = local_d8[1];
          local_b8[10] = 1.0;
          local_b8[0xb] = 1.0;
          local_1b8[0] = 0.0;
          local_1b8[1] = 0.0;
          local_1b8[2] = 0.0;
          local_1b8[3] = 0.0;
          lVar21 = (long)(pMVar4->m_data).m_data[0].m_data + lVar25;
          lVar22 = 0;
          do {
            fVar27 = 0.0;
            lVar24 = 0;
            do {
              fVar27 = fVar27 + *(float *)(lVar21 + lVar24 * 4) *
                                *(float *)((long)local_b8 + lVar24 + 0x20);
              lVar24 = lVar24 + 4;
            } while (lVar24 != 0x10);
            local_1b8[lVar22] = fVar27;
            lVar22 = lVar22 + 1;
            lVar21 = lVar21 + 4;
          } while (lVar22 != 4);
          local_158 = local_1b8;
          local_150[0] = 0;
          local_150[1] = 1;
          local_150[2] = 2;
          local_214 = 0;
          uStack_21c = 0;
          lVar21 = 3;
          do {
            local_228.m_data[lVar21] = local_1b8[local_168[lVar21 + 3]];
            lVar21 = lVar21 + 1;
          } while (lVar21 != 6);
          local_b8[4] = (float)(undefined4)local_c8;
          local_b8[5] = (float)local_c8._4_4_;
          local_b8[6] = 1.0;
          local_b8[7] = 1.0;
          local_1c8 = 0;
          uStack_1c0 = 0;
          lVar21 = (long)(pMVar4->m_data).m_data[0].m_data + lVar25;
          lVar22 = 0;
          do {
            fVar27 = 0.0;
            lVar24 = 0;
            do {
              fVar27 = fVar27 + *(float *)(lVar21 + lVar24 * 4) *
                                *(float *)((long)local_b8 + lVar24 + 0x10);
              lVar24 = lVar24 + 4;
            } while (lVar24 != 0x10);
            *(float *)((long)&local_1c8 + lVar22 * 4) = fVar27;
            lVar22 = lVar22 + 1;
            lVar21 = lVar21 + 4;
          } while (lVar22 != 4);
          local_170 = &local_1c8;
          local_168[0] = 0;
          local_168[1] = 1;
          local_168[2] = 2;
          uStack_208 = 0;
          local_210 = 0;
          lVar21 = 2;
          do {
            *(undefined4 *)((long)&uStack_21c + lVar21 * 4 + 4) =
                 *(undefined4 *)
                  ((long)&local_1c8 + (long)*(int *)((long)&local_170 + lVar21 * 4) * 4);
            lVar21 = lVar21 + 1;
          } while (lVar21 != 5);
          local_b8[2] = 1.0;
          local_b8[3] = 1.0;
          local_1d8[0] = 0.0;
          local_1d8[1] = 0.0;
          local_1d8[2] = 0.0;
          local_1d8[3] = 0.0;
          lVar21 = (long)(pMVar4->m_data).m_data[0].m_data + lVar25;
          lVar22 = 0;
          do {
            fVar27 = 0.0;
            lVar24 = 0;
            do {
              fVar27 = fVar27 + *(float *)(lVar21 + lVar24 * 4) *
                                *(float *)((long)local_b8 + lVar24);
              lVar24 = lVar24 + 4;
            } while (lVar24 != 0x10);
            local_1d8[lVar22] = fVar27;
            lVar22 = lVar22 + 1;
            lVar21 = lVar21 + 4;
          } while (lVar22 != 4);
          local_140 = local_1d8;
          local_138[0] = 0;
          local_138[1] = 1;
          local_138[2] = 2;
          afStack_204[2] = 0.0;
          afStack_204[0] = 0.0;
          afStack_204[1] = 0.0;
          lVar21 = 9;
          do {
            local_228.m_data[lVar21] = local_1d8[local_168[lVar21 + 3]];
            lVar21 = lVar21 + 1;
          } while (lVar21 != 0xc);
          afVar19[0] = local_228.m_data[0];
          afVar19[1] = local_228.m_data[1];
          local_1f8.m_data[0] = local_228.m_data[0];
          local_1f8.m_data[1] = local_228.m_data[1];
          uStack_1f0 = uStack_21c;
          uStack_1e0 = (undefined4)afStack_204._0_8_;
          uStack_1dc = SUB84(afStack_204._0_8_,4);
          local_1e8 = (undefined4)local_210;
          uStack_1e4 = local_210._4_4_;
          uVar2 = (this->m_unitTypes).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar26];
          iVar3 = (int)lVar26;
          if ((int)uVar2 < 0x8513) {
            if (uVar2 == 0xde1) {
              local_1f8.m_data = afVar19;
              sglr::rc::Texture2D::sample4
                        ((this->super_ShaderProgram).m_uniforms.
                         super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>.
                         _M_impl.super__Vector_impl_data._M_start[iVar3 * 4].sampler.tex2D,
                         &local_128,&local_1f8,0.0);
            }
            else {
              local_1f8.m_data = afVar19;
              if (uVar2 == 0x806f) {
                sglr::rc::Texture3D::sample4
                          ((this->super_ShaderProgram).m_uniforms.
                           super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar3 * 4].sampler.tex3D,
                           &local_128,&local_228,0.0);
              }
            }
          }
          else if (uVar2 == 0x8513) {
            local_1f8.m_data = afVar19;
            sglr::rc::TextureCube::sample4
                      ((this->super_ShaderProgram).m_uniforms.
                       super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>.
                       _M_impl.super__Vector_impl_data._M_start[iVar3 * 4].sampler.texCube,
                       &local_128,&local_228,0.0);
          }
          else if (uVar2 == 0x8c1a) {
            local_1f8.m_data = afVar19;
            sglr::rc::Texture2DArray::sample4
                      ((this->super_ShaderProgram).m_uniforms.
                       super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>.
                       _M_impl.super__Vector_impl_data._M_start[iVar3 * 4].sampler.tex2DArray,
                       &local_128,&local_228,0.0);
          }
          pVVar1 = (this->m_texScales).
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar26;
          fVar27 = pVVar1->m_data[0];
          fVar6 = pVVar1->m_data[1];
          fVar7 = pVVar1->m_data[2];
          fVar8 = pVVar1->m_data[3];
          pVVar1 = (this->m_texBiases).
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar26;
          fVar9 = pVVar1->m_data[0];
          fVar10 = pVVar1->m_data[1];
          fVar11 = pVVar1->m_data[2];
          fVar12 = pVVar1->m_data[3];
          lVar21 = 0;
          do {
            fVar13 = *(float *)((long)local_128.m_data + lVar21 + 4);
            fVar14 = *(float *)((long)local_128.m_data + lVar21 + 8);
            fVar15 = *(float *)((long)local_128.m_data + lVar21 + 0xc);
            fVar16 = *(float *)((long)afStack_70 + lVar21);
            fVar17 = *(float *)((long)afStack_70 + lVar21 + 4);
            *(float *)((long)&local_78 + lVar21) =
                 (*(float *)((long)local_128.m_data + lVar21) * fVar27 + fVar9) * fVar28 +
                 *(float *)((long)&local_78 + lVar21);
            *(float *)((long)&local_78 + lVar21 + 4) =
                 (fVar13 * fVar6 + fVar10) * fVar28 + *(float *)((long)&local_78 + lVar21 + 4);
            *(float *)((long)afStack_70 + lVar21) =
                 (fVar14 * fVar7 + fVar11) * afStack_230[0] + fVar16;
            *(float *)((long)afStack_70 + lVar21 + 4) =
                 (fVar15 * fVar8 + fVar12) * afStack_230[1] + fVar17;
            lVar21 = lVar21 + 0x10;
          } while (lVar21 != 0x40);
          lVar26 = lVar26 + 1;
          uVar20 = (ulong)*(int *)&(this->super_ShaderProgram).field_0x154;
          lVar25 = lVar25 + 0x40;
        } while (lVar26 < (long)uVar20);
      }
      pGVar5 = context->outputArray;
      iVar3 = context->numFragmentOutputs;
      iVar23 = iVar3 * (int)local_178;
      lVar25 = 0;
      do {
        uVar18 = *(undefined8 *)((long)afStack_70 + lVar25);
        *(undefined8 *)&pGVar5[iVar23].v = *(undefined8 *)((long)&local_78 + lVar25);
        *(undefined8 *)((long)&pGVar5[iVar23].v + 8) = uVar18;
        lVar25 = lVar25 + 0x10;
        iVar23 = iVar23 + iVar3;
      } while (lVar25 != 0x40);
      local_180 = local_180 + 1;
      local_178 = (ulong)((int)local_178 + 4);
    } while (local_180 != local_188);
  }
  return;
}

Assistant:

void MultiTexShader::shadeFragments	(rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	DE_ASSERT((int)m_unitTypes.size() == m_numUnits);
	DE_ASSERT((int)m_transformations.size() == m_numUnits);
	DE_ASSERT((int)m_lodDerivateParts.size() == m_numUnits);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		rr::FragmentPacket& packet				= packets[packetNdx];
		const float			colorMultiplier		= 1.0f / (float)m_numUnits;
		Vec4				outColors[4]		= { Vec4(0.0f), Vec4(0.0f), Vec4(0.0f), Vec4(0.0f) };

		for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
		{
			tcu::Vec4 texSamples[4];

			// Read tex coords
			const tcu::Vec2 texCoords[4] =
			{
				rr::readTriangleVarying<float>(packet, context, 0, 0).xy(),
				rr::readTriangleVarying<float>(packet, context, 0, 1).xy(),
				rr::readTriangleVarying<float>(packet, context, 0, 2).xy(),
				rr::readTriangleVarying<float>(packet, context, 0, 3).xy(),
			};

			// Transform
			tcu::Vec3 coords3D[4] =
			{
				(m_transformations[unitNdx] * Vec4(texCoords[0].x(), texCoords[0].y(), 1.0f, 1.0f)).xyz(),
				(m_transformations[unitNdx] * Vec4(texCoords[1].x(), texCoords[1].y(), 1.0f, 1.0f)).xyz(),
				(m_transformations[unitNdx] * Vec4(texCoords[2].x(), texCoords[2].y(), 1.0f, 1.0f)).xyz(),
				(m_transformations[unitNdx] * Vec4(texCoords[3].x(), texCoords[3].y(), 1.0f, 1.0f)).xyz(),
			};

			// To 2D
			const tcu::Vec2 coords2D[4] =
			{
				coords3D[0].xy(),
				coords3D[1].xy(),
				coords3D[2].xy(),
				coords3D[3].xy(),
			};

			// Sample
			switch (m_unitTypes[unitNdx])
			{
				case GL_TEXTURE_2D:			m_uniforms[4*unitNdx].sampler.tex2D->sample4(texSamples, coords2D);			break;
				case GL_TEXTURE_CUBE_MAP:	m_uniforms[4*unitNdx].sampler.texCube->sample4(texSamples, coords3D);		break;
				case GL_TEXTURE_2D_ARRAY:	m_uniforms[4*unitNdx].sampler.tex2DArray->sample4(texSamples, coords3D);	break;
				case GL_TEXTURE_3D:			m_uniforms[4*unitNdx].sampler.tex3D->sample4(texSamples, coords3D);			break;
				default:
					DE_ASSERT(DE_FALSE);
			}

			// Add to sum
			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
				outColors[fragNdx] += colorMultiplier * (texSamples[fragNdx]*m_texScales[unitNdx] + m_texBiases[unitNdx]);
		}

		// output
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, outColors[fragNdx]);
	}
}